

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O3

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this
          ,Context *context)

{
  Context **this_00;
  TestInstance *this_01;
  int *piVar1;
  uint uVar2;
  int iVar3;
  TestInstance *pTVar4;
  TextureFormat TVar5;
  TestTextureCube *this_02;
  undefined8 *puVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  Context *texture;
  int face;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  bool bVar14;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_3;
  TextureFormatInfo fmtInfo;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  PixelBufferAccess local_f8;
  RGBA local_d0;
  RGBA local_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Vec4 local_b8;
  Vec4 local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vec4 local_88;
  TextureFormatInfo local_78;
  
  pTVar4 = (TestInstance *)operator_new(0x288);
  pTVar4->m_context = context;
  pTVar4->_vptr_TestInstance = (_func_int **)&PTR__TextureCubeShadowTestInstance_00d03f40;
  pTVar4[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar4[1].m_context;
  this_01 = pTVar4 + 3;
  pTVar4[1].m_context = (Context *)0x0;
  pTVar4[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar4[2].m_context = (Context *)0x0;
  pTVar4[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar4[3].m_context = (Context *)0x0;
  pTVar4[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)&pTVar4[4].m_context,context,
             (this->m_testsParameters).super_TextureCubeTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x1c,0x1c);
  *(undefined4 *)&pTVar4[0x28]._vptr_TestInstance = 0;
  uVar2 = *(uint *)(pTVar4[1]._vptr_TestInstance + 8);
  if (uVar2 == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  TVar5 = ::vk::mapVkFormat(*(VkFormat *)(pTVar4[1]._vptr_TestInstance + 4));
  local_f8.super_ConstPixelBufferAccess.m_format.order = TVar5.order;
  local_f8.super_ConstPixelBufferAccess.m_format.type = TVar5.type;
  tcu::getTextureFormatInfo(&local_78,(TextureFormat *)&local_f8);
  local_c8 = local_78.valueMin.m_data[0];
  fStack_c4 = local_78.valueMin.m_data[1];
  fStack_c0 = local_78.valueMin.m_data[2];
  fStack_bc = local_78.valueMin.m_data[3];
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>_>_>
             *)this_00,2);
  iVar3 = 0x1f - uVar7;
  local_118 = local_78.valueMax.m_data[0];
  fStack_114 = local_78.valueMax.m_data[1];
  fStack_110 = local_78.valueMax.m_data[2];
  fStack_10c = local_78.valueMax.m_data[3];
  local_118 = local_118 - local_c8;
  fStack_114 = fStack_114 - fStack_c4;
  fStack_110 = fStack_110 - fStack_c0;
  fStack_10c = fStack_10c - fStack_bc;
  bVar14 = true;
  do {
    bVar12 = bVar14;
    this_02 = (TestTextureCube *)operator_new(0x188);
    local_b8.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar4[1]._vptr_TestInstance + 4));
    pipeline::TestTextureCube::TestTextureCube
              (this_02,(TextureFormat *)&local_b8,*(int *)(pTVar4[1]._vptr_TestInstance + 8));
    local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    local_f8.super_ConstPixelBufferAccess.m_format.order = (ChannelOrder)this_02;
    local_f8.super_ConstPixelBufferAccess.m_format.type = (ChannelType)((ulong)this_02 >> 0x20);
    puVar6 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar6 + 1) = 0;
    *(undefined4 *)((long)puVar6 + 0xc) = 0;
    *puVar6 = &PTR__SharedPtrState_00d03020;
    puVar6[2] = this_02;
    local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)puVar6;
    local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)((ulong)puVar6 >> 0x20);
    *(undefined4 *)(puVar6 + 1) = 1;
    *(undefined4 *)((long)puVar6 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTextureCube>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTextureCube>,std::allocator<de::SharedPtr<vkt::pipeline::TestTextureCube>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTextureCube> *)&local_f8);
    if (CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                 local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) != 0) {
      LOCK();
      piVar1 = (int *)(CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                                local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        local_f8.super_ConstPixelBufferAccess.m_format.order = R;
        local_f8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        (**(code **)(*(long *)CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                                       local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) +
                    0x10))();
      }
      LOCK();
      piVar1 = (int *)(CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                                local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         ((long *)CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                           local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) != (long *)0x0))
      {
        (**(code **)(*(long *)CONCAT44(local_f8.super_ConstPixelBufferAccess.m_size.m_data[1],
                                       local_f8.super_ConstPixelBufferAccess.m_size.m_data[0]) + 8))
                  ();
      }
    }
    bVar14 = false;
  } while (bVar12);
  if (texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
      TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
      ::gradients == '\0') {
    createInstance();
  }
  uVar11 = 0;
  iVar13 = 0;
  if (0 < iVar3) {
    iVar13 = iVar3;
  }
  do {
    if (uVar2 != 0) {
      lVar9 = uVar11 * 0x20;
      iVar10 = 0;
      do {
        (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
                  (&local_f8,(*this_00)->m_testCtx,iVar10,uVar11 & 0xffffffff);
        local_b8.m_data[2] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 8) * fStack_110 + fStack_c0;
        local_b8.m_data[3] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 0xc) * fStack_10c + fStack_bc;
        local_b8.m_data[1] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 4) * fStack_114 + fStack_c4;
        local_b8.m_data[0] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9) * local_118 + local_c8;
        local_a8.m_data[0] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 0x10) * local_118 + local_c8;
        local_a8.m_data[1] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 0x14) * fStack_114 + fStack_c4;
        local_a8.m_data[2] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 0x18) * fStack_110 + fStack_c0;
        local_a8.m_data[3] =
             *(float *)(texture::(anonymous_namespace)::TextureCubeShadowTestInstance::
                        TextureCubeShadowTestInstance(vkt::Context&,vkt::texture::(anonymous_namespace)::TextureCubeShadowTestCaseParameters_const&)
                        ::gradients + lVar9 + 0x1c) * fStack_10c + fStack_bc;
        tcu::fillWithComponentGradients(&local_f8,&local_b8,&local_a8);
        iVar10 = iVar10 + 1;
      } while (iVar13 + 1 != iVar10);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 6);
  iVar10 = 0;
  do {
    if (uVar2 != 0) {
      iVar8 = 0;
      do {
        (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
                  (&local_f8,(*this_00)->m_progCollection,iVar8,iVar10);
        uVar7 = (0xffffff / (iVar3 * 6 + 6U)) * iVar10 * iVar8;
        local_cc.m_value = uVar7 | 0xff000000;
        tcu::RGBA::toVec(&local_cc);
        local_d0.m_value = ~uVar7 | 0xff000000;
        local_b8.m_data[2] = local_a8.m_data[2] * fStack_110 + fStack_c0;
        local_b8.m_data[3] = local_a8.m_data[3] * fStack_10c + fStack_bc;
        local_b8.m_data[1] = local_a8.m_data[1] * fStack_114 + fStack_c4;
        local_b8.m_data[0] = local_a8.m_data[0] * local_118 + local_c8;
        tcu::RGBA::toVec(&local_d0);
        local_88.m_data[0] = local_98 * local_118 + local_c8;
        local_88.m_data[1] = fStack_94 * fStack_114 + fStack_c4;
        local_88.m_data[2] = fStack_90 * fStack_110 + fStack_c0;
        local_88.m_data[3] = fStack_8c * fStack_10c + fStack_bc;
        tcu::fillWithGrid(&local_f8,4,&local_b8,&local_88);
        iVar8 = iVar8 + 1;
      } while (iVar13 + 1 != iVar8);
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 6);
  texture = pTVar4[1].m_context;
  if (texture != (Context *)pTVar4[2]._vptr_TestInstance) {
    do {
      TextureRenderer::addCubeTexture
                ((TextureRenderer *)&pTVar4[4].m_context,(TestTextureCubeSp *)texture);
      texture = (Context *)&texture->m_progCollection;
    } while (texture != (Context *)pTVar4[2]._vptr_TestInstance);
  }
  local_118 = 0.0;
  bVar14 = *(int *)pTVar4[1]._vptr_TestInstance - 5U < 2;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       *(int *)(&DAT_00b29870 + (ulong)bVar14 * 4);
  if (!bVar14) {
    local_118 = 0.5;
  }
  local_f8.super_ConstPixelBufferAccess.m_format.order = R;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbfa00000;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40666666;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f99999a;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3fa00000;
  _local_c8 = CONCAT44(fStack_c4,local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0]);
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  local_f8.super_ConstPixelBufferAccess.m_format.order = R;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0x3f4ccccd;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f4ccccd;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3fa00000;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f99999a;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)local_118;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  local_f8.super_ConstPixelBufferAccess.m_format.order = A;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbf9851ec;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x4059999a;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f8ccccd;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3faccccd;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)local_c8;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  local_f8.super_ConstPixelBufferAccess.m_format.order = A;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbf99999a;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x40733333;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = -0x40b33333;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x40b33333;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = (int)local_118;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  local_f8.super_ConstPixelBufferAccess.m_format.order = A;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbf1c28f6;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = -0x42333333;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f666666;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f970a3d;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f8ccccd;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  local_f8.super_ConstPixelBufferAccess.m_format.order = A;
  local_f8.super_ConstPixelBufferAccess.m_format.type = 0xbf400000;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f800000;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3d4ccccd;
  local_f8.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x3f400000;
  local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = -0x42333333;
  std::
  vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
  ::push_back((vector<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance::FilterCase>_>
               *)this_01,(value_type *)&local_f8);
  return pTVar4;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}